

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O2

bool __thiscall
Qentem::Value<char16_t>::
CopyValueTo<Qentem::StringStream<char16_t>,void(Qentem::StringStream<char16_t>,char16_t_const*,unsigned_int)>
          (Value<char16_t> *this,StringStream<char16_t> *stream,RealFormatInfo format,
          _func_void_StringStream<char16_t>_char16_t_ptr_uint *string_function)

{
  int __fd;
  uint uVar1;
  RealFormatInfo format_00;
  StringStream<char16_t> SVar2;
  void *pvStack_30;
  StringStream<char16_t> local_28;
  
LAB_00111e8a:
  uVar1 = this->type_ - 1;
  if (9 < uVar1) {
LAB_00111f2f:
    return false;
  }
  format_00 = (RealFormatInfo)
              ((long)&switchD_00111e9d::switchdataD_0011c15c +
              (long)(int)(&switchD_00111e9d::switchdataD_0011c15c)[uVar1]);
  switch((uint)this->type_) {
  case 1:
    goto switchD_00111e9d_caseD_1;
  default:
    goto LAB_00111f2f;
  case 4:
    if (string_function != (_func_void_StringStream<char16_t>_char16_t_ptr_uint *)0x0) {
      StringStream<char16_t>::StringStream(&local_28,stream);
      SVar2._8_8_ = (this->field_0).array_.storage_;
      SVar2.storage_ = (char16_t *)&local_28;
      (*string_function)(SVar2,(char16_t *)(ulong)(this->field_0).array_.index_,format_00.Precision)
      ;
      Memory::Deallocate(local_28.storage_);
      return true;
    }
    __fd = (int)*(undefined8 *)&this->field_0;
    pvStack_30 = (void *)(ulong)(this->field_0).array_.index_;
    goto LAB_00111f22;
  case 5:
    Digit::NumberToString<false,Qentem::StringStream<char16_t>,unsigned_long_long>
              (stream,(unsigned_long_long)(this->field_0).array_.storage_,(RealFormatInfo)0x6);
    return true;
  case 6:
    Digit::NumberToString<false,Qentem::StringStream<char16_t>,long_long>
              (stream,(longlong)(this->field_0).array_.storage_,(RealFormatInfo)0x6);
    return true;
  case 7:
    Digit::realToString<double,Qentem::StringStream<char16_t>,unsigned_long_long>
              ((Digit *)stream,(StringStream<char16_t> *)(this->field_0).array_.storage_,
               (unsigned_long_long)format,format_00);
    return true;
  case 8:
    __fd = 0x120c62;
    break;
  case 9:
    __fd = 0x122b30;
    pvStack_30 = (void *)0x5;
    goto LAB_00111f22;
  case 10:
    __fd = 0x11ca28;
  }
  pvStack_30 = (void *)0x4;
LAB_00111f22:
  StringStream<char16_t>::write(stream,__fd,pvStack_30,(size_t)format_00);
  return true;
switchD_00111e9d_caseD_1:
  this = (this->field_0).array_.storage_;
  goto LAB_00111e8a;
}

Assistant:

bool CopyValueTo(StringStream_T             &stream,
                     const Digit::RealFormatInfo format          = Digit::RealFormatInfo{Config::DoublePrecision},
                     StringFunction_T           *string_function = nullptr) const {
        switch (Type()) {
            case ValueType::String: {
                if (string_function != nullptr) {
                    string_function(stream, string_.First(), string_.Length());
                } else {
                    stream.Write(string_.First(), string_.Length());
                }

                break;
            }

            case ValueType::UIntLong: {
                Digit::NumberToString(stream, number_.Natural);
                break;
            }

            case ValueType::IntLong: {
                Digit::NumberToString(stream, number_.Integer);
                break;
            }

            case ValueType::Double: {
                Digit::NumberToString(stream, number_.Real, format);
                break;
            }

            case ValueType::True: {
                stream.Write(JSONotation::TrueString, JSONotation::TrueStringLength);
                break;
            }

            case ValueType::False: {
                stream.Write(JSONotation::FalseString, JSONotation::FalseStringLength);
                break;
            }

            case ValueType::Null: {
                stream.Write(JSONotation::NullString, JSONotation::NullStringLength);
                break;
            }

            case ValueType::ValuePtr: {
                return value_->CopyValueTo(stream, format, string_function);
            }

            default: {
                return false;
            }
        }

        return true;
    }